

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

InterfaceHandle __thiscall
helics::CommonCore::registerPublication
          (CommonCore *this,LocalFederateId federateID,string_view key,string_view type,
          string_view units)

{
  InterfaceHandle handle;
  FederateState *this_00;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar1;
  size_t size;
  ActionMessage reg;
  ActionMessage local_e8;
  
  size = key._M_len;
  this_00 = checkNewInterface(this,federateID,key,PUBLICATION);
  puVar1 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,PUBLICATION,key,type,units,
                             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  handle.hid = *(BaseType *)
                ((long)&(puVar1->_M_t).
                        super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                        .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4);
  FederateState::createInterface
            (this_00,PUBLICATION,handle,key,type,units,
             (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i);
  ActionMessage::ActionMessage(&local_e8,cmd_reg_pub);
  local_e8.source_id.gid = (this_00->global_id)._M_i.gid;
  local_e8.source_handle.hid = handle.hid;
  local_e8.payload.bufferSize = size;
  if ((local_e8.payload.heap != (byte *)key._M_str) &&
     (SmallBuffer::reserve(&local_e8.payload,size), size != 0)) {
    memcpy(local_e8.payload.heap,key._M_str,size);
  }
  local_e8.flags =
       *(uint16_t *)
        ((long)&puVar1[1]._M_t.
                super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 6);
  ActionMessage::setStringData(&local_e8,type,units);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&local_e8);
  ActionMessage::~ActionMessage(&local_e8);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerPublication(LocalFederateId federateID,
                                                std::string_view key,
                                                std::string_view type,
                                                std::string_view units)
{
    auto* fed = checkNewInterface(federateID, key, InterfaceType::PUBLICATION);
    const auto& handle = createBasicHandle(fed->global_id,
                                           fed->local_id,
                                           InterfaceType::PUBLICATION,
                                           key,
                                           type,
                                           units,
                                           fed->getInterfaceFlags());

    auto hid = handle.handle.handle;
    fed->createInterface(
        InterfaceType::PUBLICATION, hid, key, type, units, fed->getInterfaceFlags());

    ActionMessage reg(CMD_REG_PUB);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(key);
    reg.flags = handle.flags;
    reg.setStringData(type, units);

    actionQueue.push(std::move(reg));
    return hid;
}